

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

EVaction INT_REVassoc_filter_action
                   (CMConnection conn,EVstone stone,FMStructDescList incoming_format_list,
                   char *handler,EVstone out_stone)

{
  int iVar1;
  CManager_conflict cm;
  CMConnection conn_00;
  CManager in_RCX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  EVassoc_filter_action_request request;
  EV_int_response response;
  CMFormat f;
  int cond;
  CMConnection in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  EVaction in_stack_ffffffffffffffcc;
  int condition;
  int iVar2;
  undefined4 uVar3;
  
  memset(&stack0xffffffffffffffa8,0,0x20);
  iVar1 = INT_CMCondition_get((CManager)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
  cm = (CManager_conflict)INT_CMlookup_format((CManager)*in_RDI,EVassoc_filter_action_req_formats);
  conn_00 = (CMConnection)
            get_format_name(cm,(FMStructDescList)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar2 = iVar1;
  uVar3 = in_R8D;
  if (cm == (CManager_conflict)0x0) {
    cm = (CManager_conflict)INT_CMregister_format(in_RCX,(FMStructDescList)conn_00);
  }
  condition = (int)((ulong)cm >> 0x20);
  INT_CMCondition_set_client_data
            ((CManager)CONCAT44(in_stack_ffffffffffffffc4,in_R8D),(int)((ulong)in_RCX >> 0x20),
             conn_00);
  INT_CMwrite(conn_00,(CMFormat)CONCAT44(in_ESI,iVar1),(void *)0x1549bb);
  INT_CMCondition_wait((CManager)CONCAT44(uVar3,iVar2),condition);
  return in_stack_ffffffffffffffcc;
}

Assistant:

extern EVaction
INT_REVassoc_filter_action(CMConnection conn, EVstone stone, FMStructDescList incoming_format_list, char *handler, EVstone out_stone)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVassoc_filter_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVassoc_filter_action_req_formats);
    request.stone = stone;
    request.incoming_format_list = get_format_name(conn->cm, incoming_format_list);
    request.handler = handler;
    request.out_stone = out_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVassoc_filter_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVaction) response.ret;
}